

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.cc
# Opt level: O0

void __thiscall vw_ostream::vw_ostream(vw_ostream *this)

{
  vw_streambuf *in_RDI;
  vw_ostream *in_stack_ffffffffffffffd8;
  
  std::ios::ios((ios *)&in_RDI[1].field_0x18);
  *(undefined8 *)in_RDI = 0x471b68;
  *(undefined8 *)&in_RDI[1].field_0x18 = 0x471b90;
  std::ostream::ostream(in_RDI,(streambuf *)&PTR_construction_vtable_24__00471ba8);
  *(undefined8 *)in_RDI = 0x471b68;
  *(undefined8 *)&in_RDI[1].field_0x18 = 0x471b90;
  vw_streambuf::vw_streambuf(in_RDI,in_stack_ffffffffffffffd8);
  *(undefined8 *)&in_RDI[1].field_0x8 = 0;
  *(code **)&in_RDI[1].field_0x10 = trace_listener_cerr;
  return;
}

Assistant:

vw_ostream::vw_ostream() : std::ostream(&buf), buf(*this), trace_context(nullptr)
{
  trace_listener = trace_listener_cerr;
}